

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaWildcardPtr
xmlSchemaAddWildcard
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaTypeType type,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaParserCtxtPtr local_38;
  xmlSchemaWildcardPtr ret;
  xmlNodePtr node_local;
  xmlSchemaTypeType type_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    local_38 = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x48);
    if (local_38 == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(ctxt);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(local_38,0,0x48);
      local_38->type = type;
      local_38->warning = (xmlSchemaValidityWarningFunc)node;
      if (local_38 != (xmlSchemaParserCtxtPtr)0x0) {
        iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,local_38);
        if (iVar1 < 0) {
          xmlSchemaPErrMemory(ctxt);
          (*xmlFree)(local_38);
          local_38 = (xmlSchemaParserCtxtPtr)0x0;
        }
      }
      ctxt_local = local_38;
    }
  }
  return (xmlSchemaWildcardPtr)ctxt_local;
}

Assistant:

static xmlSchemaWildcardPtr
xmlSchemaAddWildcard(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
		     xmlSchemaTypeType type, xmlNodePtr node)
{
    xmlSchemaWildcardPtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaWildcardPtr) xmlMalloc(sizeof(xmlSchemaWildcard));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaWildcard));
    ret->type = type;
    ret->node = node;
    WXS_ADD_LOCAL(ctxt, ret);
    return (ret);
}